

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QNetworkCookie>::pop_back(QList<QNetworkCookie> *this)

{
  removeLast(this);
  return;
}

Assistant:

void pop_back() noexcept { removeLast(); }